

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void pugi::impl::anon_unknown_0::node_output
               (xml_buffered_writer *writer,xml_node *node,char_t *indent,uint flags,uint depth)

{
  xml_buffered_writer *writer_00;
  void *pvVar1;
  char *pcVar2;
  undefined4 in_register_0000000c;
  char *pcVar3;
  size_t sVar4;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  void *__buf_01;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  int __fd;
  char_t *pcVar5;
  uint uVar6;
  xml_node_struct *pxVar7;
  bool bVar8;
  xml_node local_40;
  char_t *local_38;
  
  bVar8 = (flags & 5) != 1;
  sVar4 = CONCAT71((int7)(CONCAT44(in_register_0000000c,flags) >> 8),depth == 0 || bVar8);
  uVar6 = depth;
  if (depth != 0 && !bVar8) {
    do {
      pvVar1 = (void *)strlength(indent);
      xml_buffered_writer::write(writer,(int)indent,pvVar1,sVar4);
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  pxVar7 = node->_root;
  if (pxVar7 == (xml_node_struct *)0x0) {
    __assert_fail("!\"Invalid node type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                  ,0xc84,
                  "void pugi::impl::(anonymous namespace)::node_output(xml_buffered_writer &, const xml_node &, const char_t *, unsigned int, unsigned int)"
                 );
  }
  uVar6 = (uint)pxVar7->header & 7;
  pcVar3 = (char *)((long)&switchD_001155df::switchdataD_001255f0 +
                   (long)(int)(&switchD_001155df::switchdataD_001255f0)[uVar6]);
  switch(uVar6) {
  case 0:
    pxVar7 = pxVar7->first_child;
    if (pxVar7 == (xml_node_struct *)0x0) {
      return;
    }
    do {
      local_40._root = pxVar7;
      node_output(writer,&local_40,indent,flags,depth);
      pxVar7 = pxVar7->next_sibling;
    } while (pxVar7 != (xml_node_struct *)0x0);
    return;
  case 1:
    pcVar2 = pxVar7->name;
    pcVar3 = "";
    if (pcVar2 == (char *)0x0) {
      pcVar2 = "";
    }
    pcVar5 = ":anonymous";
    if (*pcVar2 != '\0') {
      pcVar5 = pcVar2;
    }
    xml_buffered_writer::write(writer,0x3c,&switchD_001155df::switchdataD_001255f0,0x125431);
    pvVar1 = (void *)strlength(pcVar5);
    xml_buffered_writer::write(writer,(int)pcVar5,pvVar1,(size_t)pcVar3);
    node_output_attributes
              ((anon_unknown_0 *)writer,(xml_buffered_writer *)node->_root,(xml_node *)(ulong)flags,
               (uint)pcVar3);
    pxVar7 = node->_root;
    if ((flags & 4) != 0) {
      if ((pxVar7 == (xml_node_struct *)0x0) || (pxVar7->first_child == (xml_node_struct *)0x0)) {
        xml_buffered_writer::write(writer,0x20,(void *)0x2f,0x3e);
        return;
      }
      local_38 = pcVar5;
      xml_buffered_writer::write(writer,0x3e,__buf_00,(size_t)pcVar3);
      if ((node->_root != (xml_node_struct *)0x0) &&
         (pxVar7 = node->_root->first_child, local_40._root = pxVar7,
         pxVar7 != (xml_node_struct *)0x0)) {
        do {
          pcVar3 = (char *)(ulong)flags;
          local_40._root = pxVar7;
          node_output(writer,&local_40,indent,flags,depth + 1);
          pxVar7 = pxVar7->next_sibling;
          local_40._root = pxVar7;
        } while (pxVar7 != (xml_node_struct *)0x0);
      }
      xml_buffered_writer::write(writer,0x3c,(void *)0x2f,(size_t)pcVar3);
      pcVar5 = local_38;
      pvVar1 = (void *)strlength(local_38);
      xml_buffered_writer::write(writer,(int)pcVar5,pvVar1,(size_t)pcVar3);
      __fd = 0x3e;
      pvVar1 = extraout_RDX_01;
      goto LAB_00115ad4;
    }
    if ((pxVar7 == (xml_node_struct *)0x0) ||
       (pxVar7 = pxVar7->first_child, pxVar7 == (xml_node_struct *)0x0)) {
      xml_buffered_writer::write(writer,0x20,(void *)0x2f,0x3e);
      return;
    }
    if ((pxVar7 != pxVar7->prev_sibling_c) ||
       ((uVar6 = (uint)pxVar7->header & 7, pcVar3 = (char *)(ulong)uVar6, uVar6 != 2 &&
        ((pxVar7->header & 7) != 3)))) {
      local_38 = pcVar5;
      xml_buffered_writer::write(writer,0x3e,(void *)0xa,(size_t)pcVar3);
      if ((node->_root != (xml_node_struct *)0x0) &&
         (pxVar7 = node->_root->first_child, local_40._root = pxVar7,
         pxVar7 != (xml_node_struct *)0x0)) {
        do {
          pcVar3 = (char *)(ulong)flags;
          local_40._root = pxVar7;
          node_output(writer,&local_40,indent,flags,depth + 1);
          pxVar7 = pxVar7->next_sibling;
          local_40._root = pxVar7;
        } while (pxVar7 != (xml_node_struct *)0x0);
      }
      bVar8 = (flags & 1) == 0;
      pcVar3 = (char *)CONCAT71((int7)((ulong)pcVar3 >> 8),bVar8 || depth == 0);
      if (!bVar8 && depth != 0) {
        do {
          pvVar1 = (void *)strlength(indent);
          xml_buffered_writer::write(writer,(int)indent,pvVar1,(size_t)pcVar3);
          depth = depth - 1;
        } while (depth != 0);
      }
      xml_buffered_writer::write(writer,0x3c,(void *)0x2f,(size_t)pcVar3);
      pcVar5 = local_38;
      pvVar1 = (void *)strlength(local_38);
      goto LAB_00115b8f;
    }
    xml_buffered_writer::write(writer,0x3e,__buf_00,(size_t)pcVar3);
    if (node->_root == (xml_node_struct *)0x0) {
      pcVar2 = "";
LAB_00115b67:
      text_output_cdata(writer,pcVar2);
    }
    else {
      pxVar7 = node->_root->first_child;
      pcVar2 = "";
      if (pxVar7 == (xml_node_struct *)0x0) goto LAB_00115b67;
      uVar6 = (uint)pxVar7->header & 7;
      pcVar3 = (char *)(ulong)uVar6;
      pcVar2 = "";
      if (pxVar7->value != (char_t *)0x0) {
        pcVar2 = pxVar7->value;
      }
      if (uVar6 != 2) goto LAB_00115b67;
      pcVar3 = (char *)(ulong)flags;
      text_output(writer,pcVar2,ctx_special_pcdata,flags);
    }
    xml_buffered_writer::write(writer,0x3c,(void *)0x2f,(size_t)pcVar3);
    pvVar1 = (void *)strlength(pcVar5);
LAB_00115b8f:
    xml_buffered_writer::write(writer,(int)pcVar5,pvVar1,(size_t)pcVar3);
    xml_buffered_writer::write(writer,0x3e,(void *)0xa,(size_t)pcVar3);
    return;
  case 2:
    pcVar2 = "";
    if (pxVar7->value != (char_t *)0x0) {
      pcVar2 = pxVar7->value;
    }
    pcVar3 = (char *)(ulong)flags;
    text_output(writer,pcVar2,ctx_special_pcdata,flags);
    pvVar1 = extraout_RDX;
    break;
  case 3:
    pcVar2 = "";
    if (pxVar7->value != (char_t *)0x0) {
      pcVar2 = pxVar7->value;
    }
    text_output_cdata(writer,pcVar2);
    pvVar1 = extraout_RDX_00;
    break;
  case 4:
    sVar4 = 0x2d;
    xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x2d);
    if (node->_root == (xml_node_struct *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar5 = node->_root->value;
      pcVar3 = "";
      if (pcVar5 != (char_t *)0x0) {
        pcVar3 = pcVar5;
      }
    }
    pvVar1 = (void *)strlength(pcVar3);
    xml_buffered_writer::write(writer,(int)pcVar3,pvVar1,sVar4);
    pcVar3 = (char *)0x3e;
    xml_buffered_writer::write(writer,0x2d,(void *)0x2d,0x3e);
    pvVar1 = extraout_RDX_02;
    break;
  default:
    xml_buffered_writer::write(writer,0x3c,(void *)0x3f,(size_t)pcVar3);
    if (node->_root == (xml_node_struct *)0x0) {
      pcVar2 = ":anonymous";
    }
    else {
      pcVar2 = node->_root->name;
      pcVar3 = "";
      if (pcVar2 != (char *)0x0) {
        pcVar3 = pcVar2;
      }
      pcVar2 = ":anonymous";
      if (*pcVar3 != '\0') {
        pcVar2 = pcVar3;
      }
    }
    pvVar1 = (void *)strlength(pcVar2);
    xml_buffered_writer::write(writer,(int)pcVar2,pvVar1,(size_t)pcVar3);
    writer_00 = (xml_buffered_writer *)node->_root;
    if (writer_00 == (xml_buffered_writer *)0x0) {
      pcVar2 = "";
LAB_001158ca:
      if (*pcVar2 != '\0') {
        xml_buffered_writer::write(writer,0x20,__buf_01,(size_t)pcVar3);
        if (node->_root == (xml_node_struct *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar5 = node->_root->value;
          pcVar2 = "";
          if (pcVar5 != (char_t *)0x0) {
            pcVar2 = pcVar5;
          }
        }
        pvVar1 = (void *)strlength(pcVar2);
        xml_buffered_writer::write(writer,(int)pcVar2,pvVar1,(size_t)pcVar3);
      }
    }
    else {
      if ((*(uint *)writer_00->buffer & 7) != 6) {
        pcVar3 = *(char **)(writer_00->buffer + 0x18);
        pcVar2 = "";
        if (pcVar3 != (char *)0x0) {
          pcVar2 = pcVar3;
        }
        goto LAB_001158ca;
      }
      node_output_attributes
                ((anon_unknown_0 *)writer,writer_00,(xml_node *)(ulong)flags,(uint)pcVar3);
    }
    xml_buffered_writer::write(writer,0x3f,(void *)0x3e,(size_t)pcVar3);
    pvVar1 = extraout_RDX_03;
    break;
  case 7:
    xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x44);
    pcVar3 = (char *)0x50;
    xml_buffered_writer::write(writer,0x54,(void *)0x59,0x50);
    if (node->_root == (xml_node_struct *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar3 = node->_root->value;
      pcVar2 = "";
      if (pcVar3 != (char *)0x0) {
        pcVar2 = pcVar3;
      }
    }
    pvVar1 = __buf;
    if (*pcVar2 != '\0') {
      xml_buffered_writer::write(writer,0x20,__buf,(size_t)pcVar3);
      if (node->_root == (xml_node_struct *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar5 = node->_root->value;
        pcVar2 = "";
        if (pcVar5 != (char_t *)0x0) {
          pcVar2 = pcVar5;
        }
      }
      pvVar1 = (void *)strlength(pcVar2);
      xml_buffered_writer::write(writer,(int)pcVar2,pvVar1,(size_t)pcVar3);
      pvVar1 = extraout_RDX_04;
    }
    xml_buffered_writer::write(writer,0x3e,pvVar1,(size_t)pcVar3);
    pvVar1 = extraout_RDX_05;
  }
  if ((flags & 4) != 0) {
    return;
  }
  __fd = 10;
LAB_00115ad4:
  xml_buffered_writer::write(writer,__fd,pvVar1,(size_t)pcVar3);
  return;
}

Assistant:

PUGI__FN void node_output(xml_buffered_writer& writer, const xml_node& node, const char_t* indent, unsigned int flags, unsigned int depth)
	{
		const char_t* default_name = PUGIXML_TEXT(":anonymous");

		if ((flags & format_indent) != 0 && (flags & format_raw) == 0)
			for (unsigned int i = 0; i < depth; ++i) writer.write(indent);

		switch (node.type())
		{
		case node_document:
		{
			for (xml_node n = node.first_child(); n; n = n.next_sibling())
				node_output(writer, n, indent, flags, depth);
			break;
		}
			
		case node_element:
		{
			const char_t* name = node.name()[0] ? node.name() : default_name;

			writer.write('<');
			writer.write(name);

			node_output_attributes(writer, node, flags);

			if (flags & format_raw)
			{
				if (!node.first_child())
					writer.write(' ', '/', '>');
				else
				{
					writer.write('>');

					for (xml_node n = node.first_child(); n; n = n.next_sibling())
						node_output(writer, n, indent, flags, depth + 1);

					writer.write('<', '/');
					writer.write(name);
					writer.write('>');
				}
			}
			else if (!node.first_child())
				writer.write(' ', '/', '>', '\n');
			else if (node.first_child() == node.last_child() && (node.first_child().type() == node_pcdata || node.first_child().type() == node_cdata))
			{
				writer.write('>');

				if (node.first_child().type() == node_pcdata)
					text_output(writer, node.first_child().value(), ctx_special_pcdata, flags);
				else
					text_output_cdata(writer, node.first_child().value());

				writer.write('<', '/');
				writer.write(name);
				writer.write('>', '\n');
			}
			else
			{
				writer.write('>', '\n');
				
				for (xml_node n = node.first_child(); n; n = n.next_sibling())
					node_output(writer, n, indent, flags, depth + 1);

				if ((flags & format_indent) != 0 && (flags & format_raw) == 0)
					for (unsigned int i = 0; i < depth; ++i) writer.write(indent);
				
				writer.write('<', '/');
				writer.write(name);
				writer.write('>', '\n');
			}

			break;
		}
		
		case node_pcdata:
			text_output(writer, node.value(), ctx_special_pcdata, flags);
			if ((flags & format_raw) == 0) writer.write('\n');
			break;

		case node_cdata:
			text_output_cdata(writer, node.value());
			if ((flags & format_raw) == 0) writer.write('\n');
			break;

		case node_comment:
			writer.write('<', '!', '-', '-');
			writer.write(node.value());
			writer.write('-', '-', '>');
			if ((flags & format_raw) == 0) writer.write('\n');
			break;

		case node_pi:
		case node_declaration:
			writer.write('<', '?');
			writer.write(node.name()[0] ? node.name() : default_name);

			if (node.type() == node_declaration)
			{
				node_output_attributes(writer, node, flags);
			}
			else if (node.value()[0])
			{
				writer.write(' ');
				writer.write(node.value());
			}

			writer.write('?', '>');
			if ((flags & format_raw) == 0) writer.write('\n');
			break;

		case node_doctype:
			writer.write('<', '!', 'D', 'O', 'C');
			writer.write('T', 'Y', 'P', 'E');

			if (node.value()[0])
			{
				writer.write(' ');
				writer.write(node.value());
			}

			writer.write('>');
			if ((flags & format_raw) == 0) writer.write('\n');
			break;

		default:
			assert(!"Invalid node type");
		}
	}